

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduling_tests.hpp
# Opt level: O3

void test_parallel_group(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar5;
  size_type *psVar6;
  uint __len;
  uint __val;
  test __t;
  string __str;
  shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
  spTask;
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spFork;
  test local_b3;
  task_priority local_b2 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [32];
  task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>
  *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [32];
  anon_class_16_2_3f1e6b32_for_func_ local_40;
  
  test::test(&local_b3,"test_parallel_group");
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Fork","");
  local_b2[1] = 2;
  local_90._0_4_ = gTaskCount;
  local_40.func = (_func_unsigned_long_unsigned_long *)((ulong)(uint)local_40.func._4_4_ << 0x20);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)local_60,
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)&local_70,
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,&local_b0,local_b2 + 1,(int *)local_90,(int *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (0 < gTaskCount) {
    __val = 0;
    do {
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            __len = __len - 2;
            goto LAB_001699ff;
          }
          if (uVar3 < 1000) {
            __len = __len - 1;
            goto LAB_001699ff;
          }
          if (uVar3 < 10000) goto LAB_001699ff;
          uVar5 = uVar5 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar3);
        __len = __len + 1;
      }
LAB_001699ff:
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_90,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90._0_8_,__len,__val);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1c71c7);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar4[3];
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_b2[0] = normal;
      local_40.func = fibonacci;
      local_40.args.super__Tuple_impl<0UL,_unsigned_long_long>.
      super__Head_base<0UL,_unsigned_long_long,_false>._M_head_impl =
           (_Tuple_impl<0UL,_unsigned_long_long>)
           (_Head_base<0UL,_unsigned_long_long,_false>)0x989680;
      local_70 = (task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>
                  *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<oqpi::task<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::make_task<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,unsigned_long(&)(unsigned_long),unsigned_long_long_const&>(std::__cxx11::string_const&,oqpi::task_priority,unsigned_long(&)(unsigned_long),unsigned_long_long_const&)::_lambda()_1_>,std::allocator<oqpi::task<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::make_task<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,unsigned_long(&)(unsigned_long),unsigned_long_long_const&>(std::__cxx11::string_const&,oqpi::task_priority,unsigned_long(&)(unsigned_long),unsigned_long_long_const&)::_lambda()_1_>>,std::__cxx11::string_const&,oqpi::task_priority&,oqpi::make_task<(oqpi::task_type)0,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>,oqpi::context_container<oqpi::task_base,timer_task_context>,unsigned_long(&)(unsigned_long),unsigned_long_long_const&>(std::__cxx11::string_const&,oqpi::task_priority,unsigned_long(&)(unsigned_long),unsigned_long_long_const&)::_lambda()_1_>
                (&local_68,&local_70,
                 (allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
                  *)(local_b2 + 1),&local_b0,local_b2,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_90._0_8_ != (element_type *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,
                        (ulong)((long)&(((__uniq_ptr_data<oqpi::worker_base,_std::default_delete<oqpi::worker_base>,_true,_true>
                                          *)local_90._16_8_)->
                                       super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                                       )._M_t.
                                       super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                                       .super__Head_base<0UL,_oqpi::worker_base_*,_false>.
                                       _M_head_impl + 1));
      }
      if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
        }
      }
      local_60._16_8_ = local_70;
      local_60._24_8_ = local_68._M_pi;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                 *)local_60._0_8_,(task_handle *)(local_60 + 0x10));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_);
      }
      if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
      }
      __val = __val + 1;
    } while ((int)__val < gTaskCount);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
    }
  }
  local_b0._M_dataplus._M_p = (pointer)local_60._0_8_;
  local_b0._M_string_length = local_60._8_8_;
  oqpi::scheduler<concurrent_queue>::add
            ((scheduler<concurrent_queue> *)local_90,
             (task_handle *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
  }
  oqpi::task_handle::validate((task_handle *)local_90);
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)&(((((__uniq_ptr_data<oqpi::worker_base,_std::default_delete<oqpi::worker_base>,_true,_true>
                             *)local_90._0_8_)->
                          super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                          )._M_t.
                          super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                          .super__Head_base<0UL,_oqpi::worker_base_*,_false>._M_head_impl)->config_)
                        .threadAttributes + 0x10))->_M_allocated_capacity)();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  test::~test(&local_b3);
  return;
}

Assistant:

void test_parallel_group()
{
    TEST_FUNC;

    auto spFork = oqpi_tk::make_parallel_group<oqpi::task_type::waitable>("Fork", oqpi::task_priority::normal, gTaskCount);
    for (auto i = 0; i < gTaskCount; ++i)
    {
        auto spTask = oqpi_tk::make_task_item("FibonacciFork" + std::to_string(i), fibonacci, gValue);
        spFork->addTask(spTask);
    }
    oqpi_tk::schedule_task(oqpi::task_handle(spFork)).wait();
}